

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parsedoffset.cc
# Opt level: O2

string * make_objdesc_abi_cxx11_
                   (string *__return_storage_ptr__,qpdf_offset_t offset,QPDFObjectHandle *obj)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar3 = std::operator<<(local_198,"offset = ");
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  poVar3 = std::operator<<(poVar3," (0x");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::operator<<(poVar3,"), ");
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 == '\0') {
    pcVar4 = "direct, ";
    poVar3 = local_198;
  }
  else {
    poVar3 = std::operator<<(local_198,"indirect ");
    iVar2 = QPDFObjectHandle::getObjectID();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"/");
    iVar2 = QPDFObjectHandle::getGeneration();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    pcVar4 = ", ";
  }
  std::operator<<(poVar3,pcVar4);
  pcVar4 = (char *)QPDFObjectHandle::getTypeName();
  std::operator<<(local_198,pcVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string
make_objdesc(qpdf_offset_t offset, QPDFObjectHandle obj)
{
    std::stringstream ss;
    ss << "offset = " << offset << " (0x" << std::hex << offset << std::dec << "), ";

    if (obj.isIndirect()) {
        ss << "indirect " << obj.getObjectID() << "/" << obj.getGeneration() << ", ";
    } else {
        ss << "direct, ";
    }

    ss << obj.getTypeName();

    return ss.str();
}